

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_15::ConsoleReporter::printRegisteredReporters(ConsoleReporter *this)

{
  reporterMap *prVar1;
  anon_class_8_1_8991fb9c local_18;
  anon_class_8_1_8991fb9c printReporters;
  ConsoleReporter *this_local;
  
  printReporters.this = this;
  printVersion(this);
  local_18.this = this;
  prVar1 = getListeners();
  printRegisteredReporters::anon_class_8_1_8991fb9c::operator()(&local_18,prVar1,"listeners");
  prVar1 = getReporters();
  printRegisteredReporters::anon_class_8_1_8991fb9c::operator()(&local_18,prVar1,"reporters");
  return;
}

Assistant:

void printRegisteredReporters() {
            printVersion();
            auto printReporters = [this] (const reporterMap& reporters, const char* type) {
                if(reporters.size()) {
                    s << Color::Cyan << "[doctest] " << Color::None << "listing all registered " << type << "\n";
                    for(auto& curr : reporters)
                        s << "priority: " << std::setw(5) << curr.first.first
                          << " name: " << curr.first.second << "\n";
                }
            };
            printReporters(getListeners(), "listeners");
            printReporters(getReporters(), "reporters");
        }